

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O1

Status __thiscall
leveldb::Table::Open
          (Table *this,Options *options,RandomAccessFile *file,uint64_t size,Table **table)

{
  int iVar1;
  Block *this_00;
  Rep *this_01;
  undefined4 extraout_var;
  Table *this_02;
  long lVar3;
  Options *pOVar4;
  Rep *pRVar5;
  long in_FS_OFFSET;
  byte bVar6;
  ReadOptions opt;
  Footer footer;
  Slice footer_input;
  BlockContents index_block_contents;
  char footer_space [48];
  Rep *local_d0;
  ReadOptions local_c8;
  Footer local_b8;
  char *local_90;
  undefined8 local_88;
  undefined1 local_80 [32];
  undefined8 local_60;
  long local_38;
  uint64_t uVar2;
  
  bVar6 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *table = (Table *)0x0;
  if (size < 0x30) {
    local_80._24_8_ = "file is too short to be an sstable";
    local_60 = 0x22;
    local_b8.metaindex_handle_.offset_ = 0x8a9dc6;
    local_b8.metaindex_handle_.size_ = 0;
    Status::Status((Status *)this,kCorruption,(Slice *)(local_80 + 0x18),(Slice *)&local_b8);
  }
  else {
    local_90 = "";
    local_88 = 0;
    (*file->_vptr_RandomAccessFile[2])(this,file,size - 0x30,0x30,&local_90,local_80 + 0x18);
    if (this->rep_ == (Rep *)0x0) {
      local_b8.index_handle_.offset_._0_4_ = 0xffffffff;
      local_b8.index_handle_.offset_._4_4_ = 0xffffffff;
      local_b8.index_handle_.size_._0_4_ = 0xffffffff;
      local_b8.index_handle_.size_._4_4_ = 0xffffffff;
      local_b8.metaindex_handle_.offset_ = 0xffffffffffffffff;
      local_b8.metaindex_handle_.size_ = 0xffffffffffffffff;
      Footer::DecodeFrom((Footer *)local_80,(Slice *)&local_b8);
      pRVar5 = this->rep_;
      this->rep_ = (Rep *)local_80._0_8_;
      local_80._0_8_ = pRVar5;
      if (pRVar5 != (Rep *)0x0) {
        operator_delete__(pRVar5);
      }
      if (this->rep_ == (Rep *)0x0) {
        local_80._0_8_ = "";
        local_80._8_8_ = 0;
        local_c8.verify_checksums = false;
        local_c8.fill_cache = true;
        local_c8.snapshot = (Snapshot *)0x0;
        if (options->paranoid_checks == true) {
          local_c8.verify_checksums = true;
          local_c8.fill_cache = true;
        }
        ReadBlock((leveldb *)&local_d0,file,&local_c8,&local_b8.index_handle_,
                  (BlockContents *)local_80);
        pRVar5 = this->rep_;
        this->rep_ = local_d0;
        local_d0 = pRVar5;
        if (pRVar5 != (Rep *)0x0) {
          operator_delete__(pRVar5);
        }
        if (this->rep_ == (Rep *)0x0) {
          this_00 = (Block *)operator_new(0x18);
          Block::Block(this_00,(BlockContents *)local_80);
          this_01 = (Rep *)operator_new(0xa0);
          Options::Options((Options *)this_01);
          (this_01->status).state_ = (char *)0x0;
          pOVar4 = options;
          pRVar5 = this_01;
          for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
            (pRVar5->options).comparator = pOVar4->comparator;
            pOVar4 = (Options *)((long)pOVar4 + (ulong)bVar6 * -0x10 + 8);
            pRVar5 = (Rep *)((long)pRVar5 + (ulong)bVar6 * -0x10 + 8);
          }
          this_01->file = file;
          (this_01->metaindex_handle).offset_ = local_b8.metaindex_handle_.offset_;
          (this_01->metaindex_handle).size_ = local_b8.metaindex_handle_.size_;
          this_01->index_block = this_00;
          if (options->block_cache == (Cache *)0x0) {
            uVar2 = 0;
          }
          else {
            iVar1 = (*options->block_cache->_vptr_Cache[7])();
            uVar2 = CONCAT44(extraout_var,iVar1);
          }
          this_01->cache_id = uVar2;
          this_01->filter = (FilterBlockReader *)0x0;
          this_01->filter_data = (char *)0x0;
          this_02 = (Table *)operator_new(8);
          this_02->rep_ = this_01;
          *table = this_02;
          ReadMeta(this_02,&local_b8);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status Table::Open(const Options& options, RandomAccessFile* file,
                   uint64_t size, Table** table) {
  *table = nullptr;
  if (size < Footer::kEncodedLength) {
    return Status::Corruption("file is too short to be an sstable");
  }

  char footer_space[Footer::kEncodedLength];
  Slice footer_input;
  Status s = file->Read(size - Footer::kEncodedLength, Footer::kEncodedLength,
                        &footer_input, footer_space);
  if (!s.ok()) return s;

  Footer footer;
  s = footer.DecodeFrom(&footer_input);
  if (!s.ok()) return s;

  // Read the index block
  BlockContents index_block_contents;
  if (s.ok()) {
    ReadOptions opt;
    if (options.paranoid_checks) {
      opt.verify_checksums = true;
    }
    s = ReadBlock(file, opt, footer.index_handle(), &index_block_contents);
  }

  if (s.ok()) {
    // We've successfully read the footer and the index block: we're
    // ready to serve requests.
    Block* index_block = new Block(index_block_contents);
    Rep* rep = new Table::Rep;
    rep->options = options;
    rep->file = file;
    rep->metaindex_handle = footer.metaindex_handle();
    rep->index_block = index_block;
    rep->cache_id = (options.block_cache ? options.block_cache->NewId() : 0);
    rep->filter_data = nullptr;
    rep->filter = nullptr;
    *table = new Table(rep);
    (*table)->ReadMeta(footer);
  }

  return s;
}